

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> * __thiscall
immutable::ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_>::
operator=(ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *this
         ,ref<immutable::rrb_details::internal_node<immutable::vector<char,_false,_6>,_true>_> *r)

{
  internal_node<immutable::vector<char,_false,_6>,_true> *piVar1;
  internal_node<immutable::vector<char,_false,_6>,_true> *p_node;
  
  piVar1 = r->ptr;
  if (piVar1 != (internal_node<immutable::vector<char,_false,_6>,_true> *)0x0) {
    LOCK();
    (piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i =
         (piVar1->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
  }
  p_node = this->ptr;
  this->ptr = piVar1;
  rrb_details::release<immutable::vector<char,false,6>>(p_node);
  return this;
}

Assistant:

ref<T>& ref<T>::operator = (const ref<T>& r)
      {
      ref<T> temp(r);
      swap(temp);
      return *this;
      }